

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O0

bool __thiscall
Imf_2_5::DwaCompressor::Classifier::match(Classifier *this,string *suffix,PixelType type)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __result;
  int in_EDX;
  string *in_RSI;
  long in_RDI;
  string tmp;
  _func_int_int *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  __type_conflict local_1;
  
  if (*(int *)(in_RDI + 0x24) == in_EDX) {
    if ((*(byte *)(in_RDI + 0x2c) & 1) == 0) {
      local_1 = std::operator==(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    }
    else {
      std::__cxx11::string::string((string *)&stack0xffffffffffffffc0,in_RSI);
      __first._M_current = (char *)std::__cxx11::string::begin();
      __last._M_current = (char *)std::__cxx11::string::end();
      __result._M_current = (char *)std::__cxx11::string::begin();
      std::
      transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
                (__first,__last,__result,in_stack_ffffffffffffffa0);
      local_1 = std::operator==(in_stack_ffffffffffffffc0,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__first._M_current);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool match (const std::string &suffix, const PixelType type) const
    {
        if (_type != type) return false;

        if (_caseInsensitive) 
        {
            std::string tmp(suffix);
            std::transform(tmp.begin(), tmp.end(), tmp.begin(), tolower);
            return tmp == _suffix;
        }

        return suffix == _suffix;
    }